

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O0

void ImStb::stb_textedit_find_charpos
               (StbFindState *find,ImGuiInputTextState *str,int n,int single_line)

{
  int iVar1;
  float fVar2;
  int local_44;
  int first;
  int i;
  int z;
  int prev_start;
  StbTexteditRow r;
  int single_line_local;
  int n_local;
  ImGuiInputTextState *str_local;
  StbFindState *find_local;
  
  i = 0;
  r.ymax = (float)single_line;
  r.num_chars = n;
  iVar1 = STB_TEXTEDIT_STRINGLEN(str);
  local_44 = 0;
  if (r.num_chars == iVar1) {
    if (r.ymax == 0.0) {
      find->y = 0.0;
      find->x = 0.0;
      find->height = 1.0;
      for (; local_44 < iVar1; local_44 = (int)r.ymin + local_44) {
        STB_TEXTEDIT_LAYOUTROW((StbTexteditRow *)&z,str,local_44);
        i = local_44;
      }
      find->first_char = local_44;
      find->length = 0;
      find->prev_first = i;
    }
    else {
      STB_TEXTEDIT_LAYOUTROW((StbTexteditRow *)&z,str,0);
      find->y = 0.0;
      find->first_char = 0;
      find->length = iVar1;
      find->height = r.baseline_y_delta - r.x1;
      find->x = (float)prev_start;
    }
  }
  else {
    find->y = 0.0;
    while (iVar1 = local_44, STB_TEXTEDIT_LAYOUTROW((StbTexteditRow *)&z,str,local_44),
          local_44 + (int)r.ymin <= r.num_chars) {
      i = local_44;
      local_44 = (int)r.ymin + local_44;
      find->y = r.x0 + find->y;
    }
    find->first_char = local_44;
    find->length = (int)r.ymin;
    find->height = r.baseline_y_delta - r.x1;
    find->prev_first = i;
    find->x = (float)z;
    for (local_44 = 0; iVar1 + local_44 < r.num_chars; local_44 = local_44 + 1) {
      fVar2 = STB_TEXTEDIT_GETWIDTH(str,iVar1,local_44);
      find->x = fVar2 + find->x;
    }
  }
  return;
}

Assistant:

static void stb_textedit_find_charpos(StbFindState *find, STB_TEXTEDIT_STRING *str, int n, int single_line)
{
   StbTexteditRow r;
   int prev_start = 0;
   int z = STB_TEXTEDIT_STRINGLEN(str);
   int i=0, first;

   if (n == z) {
      // if it's at the end, then find the last line -- simpler than trying to
      // explicitly handle this case in the regular code
      if (single_line) {
         STB_TEXTEDIT_LAYOUTROW(&r, str, 0);
         find->y = 0;
         find->first_char = 0;
         find->length = z;
         find->height = r.ymax - r.ymin;
         find->x = r.x1;
      } else {
         find->y = 0;
         find->x = 0;
         find->height = 1;
         while (i < z) {
            STB_TEXTEDIT_LAYOUTROW(&r, str, i);
            prev_start = i;
            i += r.num_chars;
         }
         find->first_char = i;
         find->length = 0;
         find->prev_first = prev_start;
      }
      return;
   }

   // search rows to find the one that straddles character n
   find->y = 0;

   for(;;) {
      STB_TEXTEDIT_LAYOUTROW(&r, str, i);
      if (n < i + r.num_chars)
         break;
      prev_start = i;
      i += r.num_chars;
      find->y += r.baseline_y_delta;
   }

   find->first_char = first = i;
   find->length = r.num_chars;
   find->height = r.ymax - r.ymin;
   find->prev_first = prev_start;

   // now scan to find xpos
   find->x = r.x0;
   for (i=0; first+i < n; ++i)
      find->x += STB_TEXTEDIT_GETWIDTH(str, first, i);
}